

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int on_header(nghttp2_session *session,nghttp2_frame *frame,uint8_t *name,size_t namelen,
             uint8_t *value,size_t valuelen,uint8_t flags,void *userp)

{
  int32_t stream_id;
  HTTP *pHVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_easy *data;
  char *pcVar6;
  void *pvVar7;
  Curl_easy *pCVar8;
  uint uVar9;
  int iVar11;
  uint *puVar12;
  bool bVar13;
  char buffer [32];
  size_t sVar10;
  
  stream_id = (frame->hd).stream_id;
  sVar10 = namelen;
  data = (Curl_easy *)nghttp2_session_get_stream_user_data(session,stream_id);
  iVar11 = -0x386;
  iVar4 = -0x386;
  if (data != (Curl_easy *)0x0) {
    pHVar1 = (data->req).p.http;
    if (pHVar1 == (HTTP *)0x0) {
      puVar12 = (uint *)0x0;
    }
    else {
      puVar12 = (uint *)pHVar1->h2_ctx;
    }
    if (puVar12 == (uint *)0x0) {
      Curl_failf(data,"Internal NULL stream");
    }
    else if ((frame->hd).type == '\x05') {
      iVar4 = strcmp(":authority",(char *)name);
      if (iVar4 == 0) {
        bVar13 = false;
        pcVar6 = curl_maprintf("%s:%d",*(undefined8 *)(*(long *)((long)userp + 0x18) + 0x50),
                               (ulong)*(uint *)(*(long *)((long)userp + 0x18) + 0x46c));
        if (pcVar6 == (char *)0x0) {
          iVar11 = -0x386;
        }
        else {
          iVar4 = curl_strequal(pcVar6,(char *)value);
          iVar11 = 0;
          bVar13 = true;
          if ((iVar4 == 0) &&
             ((lVar2 = *(long *)((long)userp + 0x18),
              *(int *)(lVar2 + 0x46c) != *(int *)(*(long *)(lVar2 + 0x2b0) + 0x80) ||
              (iVar4 = curl_strequal(*(char **)(lVar2 + 0x50),(char *)value), iVar11 = 0,
              bVar13 = true, iVar4 == 0)))) {
            bVar13 = false;
            nghttp2_submit_rst_stream(session,'\0',stream_id,1);
            iVar11 = -0x386;
          }
          (*Curl_cfree)(pcVar6);
        }
        if (!bVar13) {
          return iVar11;
        }
      }
      if (*(void **)(puVar12 + 0x4a) == (void *)0x0) {
        puVar12[0x4e] = 10;
        puVar12[0x4f] = 0;
        pvVar7 = (*Curl_cmalloc)(0x50);
        *(void **)(puVar12 + 0x4a) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          return -0x209;
        }
        puVar12[0x4c] = 0;
        puVar12[0x4d] = 0;
      }
      else {
        uVar3 = *(ulong *)(puVar12 + 0x4e);
        if (*(ulong *)(puVar12 + 0x4c) == uVar3) {
          if (uVar3 < 0x3e9) {
            *(ulong *)(puVar12 + 0x4e) = uVar3 * 2;
            pvVar7 = Curl_saferealloc(*(void **)(puVar12 + 0x4a),uVar3 << 4);
            bVar13 = pvVar7 != (void *)0x0;
            if (!bVar13) {
              iVar11 = -0x209;
            }
          }
          else {
            pvVar7 = (void *)0x0;
            Curl_failf(data,"Too many PUSH_PROMISE headers");
            (*Curl_cfree)(*(void **)(puVar12 + 0x4a));
            iVar11 = -0x209;
            bVar13 = false;
          }
          *(void **)(puVar12 + 0x4a) = pvVar7;
          if (!bVar13) {
            return iVar11;
          }
        }
      }
      pcVar6 = curl_maprintf("%s:%s",name,value);
      iVar4 = 0;
      if (pcVar6 != (char *)0x0) {
        lVar2 = *(long *)(puVar12 + 0x4c);
        *(long *)(puVar12 + 0x4c) = lVar2 + 1;
        *(char **)(*(long *)(puVar12 + 0x4a) + lVar2 * 8) = pcVar6;
      }
    }
    else if ((char)puVar12[0x54] == '\x01') {
      if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
         (0 < *(int *)(*userp + 0xc))) {
        Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] trailer: %.*s: %.*s",(ulong)*puVar12,
                          namelen & 0xffffffff,name,valuelen,value);
      }
      CVar5 = Curl_dynhds_add((dynhds *)(puVar12 + 0x36),(char *)name,namelen,(char *)value,valuelen
                             );
      iVar4 = -0x386;
      if (CVar5 == CURLE_OK) {
        iVar4 = 0;
      }
    }
    else if ((namelen == 7) &&
            (uVar9 = *(uint *)(name + 3) ^ 0x73757461 | *(uint *)name ^ 0x6174733a,
            sVar10 = (size_t)uVar9, uVar9 == 0)) {
      CVar5 = Curl_http_decode_status((int *)(puVar12 + 0x50),(char *)value,valuelen);
      iVar4 = -0x386;
      if (CVar5 == CURLE_OK) {
        sVar10 = (size_t)puVar12[0x50];
        curl_msnprintf(buffer,0x20,":status:%u\r");
        CVar5 = Curl_headers_push(data,buffer,'\x10');
        if (((CVar5 == CURLE_OK) &&
            (CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)"HTTP/2 ",(char *)0x7,
                                       sVar10), CVar5 == CURLE_OK)) &&
           ((CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)value,(char *)valuelen,
                                       sVar10), CVar5 == CURLE_OK &&
            (CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)" \r\n",(char *)0x3,sVar10)
            , CVar5 == CURLE_OK)))) {
          if (userp == (void *)0x0) {
            pCVar8 = (Curl_easy *)0x0;
          }
          else {
            pCVar8 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
          }
          if (pCVar8 != data) {
            Curl_expire(data,0,EXPIRE_RUN_NOW);
          }
          iVar4 = 0;
          if (((userp != (void *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0))
             && (0 < *(int *)(*userp + 0xc))) {
            iVar4 = 0;
            Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] status: HTTP/2 %03d",(ulong)*puVar12,
                              (ulong)puVar12[0x50]);
          }
        }
      }
    }
    else {
      CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)name,(char *)namelen,sVar10);
      if ((CVar5 == CURLE_OK) &&
         (((CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x8da140,(char *)0x2,sVar10)
           , CVar5 == CURLE_OK &&
           (CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)value,(char *)valuelen,
                                      sVar10), CVar5 == CURLE_OK)) &&
          (CVar5 = recvbuf_write_hds((Curl_cfilter *)data,(Curl_easy *)0x8f6d5d,(char *)0x2,sVar10),
          CVar5 == CURLE_OK)))) {
        if (userp == (void *)0x0) {
          pCVar8 = (Curl_easy *)0x0;
        }
        else {
          pCVar8 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
        }
        if (pCVar8 != data) {
          Curl_expire(data,0,EXPIRE_RUN_NOW);
        }
        iVar4 = 0;
        if (((userp != (void *)0x0) &&
            (iVar4 = 0, (*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
           (0 < *(int *)(*userp + 0xc))) {
          iVar4 = 0;
          Curl_trc_cf_infof(data,(Curl_cfilter *)userp,"[%d] header: %.*s: %.*s",(ulong)*puVar12,
                            namelen & 0xffffffff,name,valuelen,value);
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int on_header(nghttp2_session *session, const nghttp2_frame *frame,
                     const uint8_t *name, size_t namelen,
                     const uint8_t *value, size_t valuelen,
                     uint8_t flags,
                     void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s;
  int32_t stream_id = frame->hd.stream_id;
  CURLcode result;
  (void)flags;

  DEBUGASSERT(stream_id); /* should never be a zero stream ID here */

  /* get the stream from the hash based on Stream ID */
  data_s = nghttp2_session_get_stream_user_data(session, stream_id);
  if(!data_s)
    /* Receiving a Stream ID not in the hash should not happen, this is an
       internal error more than anything else! */
    return NGHTTP2_ERR_CALLBACK_FAILURE;

  stream = H2_STREAM_CTX(data_s);
  if(!stream) {
    failf(data_s, "Internal NULL stream");
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  /* Store received PUSH_PROMISE headers to be used when the subsequent
     PUSH_PROMISE callback comes */
  if(frame->hd.type == NGHTTP2_PUSH_PROMISE) {
    char *h;

    if(!strcmp(HTTP_PSEUDO_AUTHORITY, (const char *)name)) {
      /* pseudo headers are lower case */
      int rc = 0;
      char *check = aprintf("%s:%d", cf->conn->host.name,
                            cf->conn->remote_port);
      if(!check)
        /* no memory */
        return NGHTTP2_ERR_CALLBACK_FAILURE;
      if(!strcasecompare(check, (const char *)value) &&
         ((cf->conn->remote_port != cf->conn->given->defport) ||
          !strcasecompare(cf->conn->host.name, (const char *)value))) {
        /* This is push is not for the same authority that was asked for in
         * the URL. RFC 7540 section 8.2 says: "A client MUST treat a
         * PUSH_PROMISE for which the server is not authoritative as a stream
         * error of type PROTOCOL_ERROR."
         */
        (void)nghttp2_submit_rst_stream(session, NGHTTP2_FLAG_NONE,
                                        stream_id, NGHTTP2_PROTOCOL_ERROR);
        rc = NGHTTP2_ERR_CALLBACK_FAILURE;
      }
      free(check);
      if(rc)
        return rc;
    }

    if(!stream->push_headers) {
      stream->push_headers_alloc = 10;
      stream->push_headers = malloc(stream->push_headers_alloc *
                                    sizeof(char *));
      if(!stream->push_headers)
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      stream->push_headers_used = 0;
    }
    else if(stream->push_headers_used ==
            stream->push_headers_alloc) {
      char **headp;
      if(stream->push_headers_alloc > 1000) {
        /* this is beyond crazy many headers, bail out */
        failf(data_s, "Too many PUSH_PROMISE headers");
        Curl_safefree(stream->push_headers);
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers_alloc *= 2;
      headp = Curl_saferealloc(stream->push_headers,
                               stream->push_headers_alloc * sizeof(char *));
      if(!headp) {
        stream->push_headers = NULL;
        return NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE;
      }
      stream->push_headers = headp;
    }
    h = aprintf("%s:%s", name, value);
    if(h)
      stream->push_headers[stream->push_headers_used++] = h;
    return 0;
  }

  if(stream->bodystarted) {
    /* This is a trailer */
    CURL_TRC_CF(data_s, cf, "[%d] trailer: %.*s: %.*s",
                stream->id, (int)namelen, name, (int)valuelen, value);
    result = Curl_dynhds_add(&stream->resp_trailers,
                             (const char *)name, namelen,
                             (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;

    return 0;
  }

  if(namelen == sizeof(HTTP_PSEUDO_STATUS) - 1 &&
     memcmp(HTTP_PSEUDO_STATUS, name, namelen) == 0) {
    /* nghttp2 guarantees :status is received first and only once. */
    char buffer[32];
    result = Curl_http_decode_status(&stream->status_code,
                                     (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    msnprintf(buffer, sizeof(buffer), HTTP_PSEUDO_STATUS ":%u\r",
              stream->status_code);
    result = Curl_headers_push(data_s, buffer, CURLH_PSEUDO);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, STRCONST("HTTP/2 "));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* the space character after the status code is mandatory */
    result = recvbuf_write_hds(cf, data_s, STRCONST(" \r\n"));
    if(result)
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    /* if we receive data for another handle, wake that up */
    if(CF_DATA_CURRENT(cf) != data_s)
      Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

    CURL_TRC_CF(data_s, cf, "[%d] status: HTTP/2 %03d",
                stream->id, stream->status_code);
    return 0;
  }

  /* nghttp2 guarantees that namelen > 0, and :status was already
     received, and this is not pseudo-header field . */
  /* convert to an HTTP1-style header */
  result = recvbuf_write_hds(cf, data_s, (const char *)name, namelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST(": "));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, (const char *)value, valuelen);
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  result = recvbuf_write_hds(cf, data_s, STRCONST("\r\n"));
  if(result)
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  /* if we receive data for another handle, wake that up */
  if(CF_DATA_CURRENT(cf) != data_s)
    Curl_expire(data_s, 0, EXPIRE_RUN_NOW);

  CURL_TRC_CF(data_s, cf, "[%d] header: %.*s: %.*s",
              stream->id, (int)namelen, name, (int)valuelen, value);

  return 0; /* 0 is successful */
}